

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_exp2nextreg(FuncState *fs,expdesc *e)

{
  byte bVar1;
  
  luaK_dischargevars(fs,e);
  if (e->k == VNONRELOC) {
    freereg(fs,(e->u).info);
  }
  luaK_checkstack(fs,1);
  bVar1 = fs->freereg + 1;
  fs->freereg = bVar1;
  exp2reg(fs,e,bVar1 - 1);
  return;
}

Assistant:

void luaK_exp2nextreg (FuncState *fs, expdesc *e) {
  luaK_dischargevars(fs, e);
  freeexp(fs, e);
  luaK_reserveregs(fs, 1);
  exp2reg(fs, e, fs->freereg - 1);
}